

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_source_panner.cpp
# Opt level: O3

Matrix3d * __thiscall
ear::QuadRegion::_calcPolyBasis
          (Matrix3d *__return_storage_ptr__,QuadRegion *this,MatrixXd *positions)

{
  double *pdVar1;
  long lVar2;
  ulong uVar3;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *this_00;
  DstEvaluatorType dstEvaluator;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  Matrix3d polyBasis;
  Matrix3d *local_198;
  long local_190;
  long local_188;
  long local_180;
  double local_178;
  double dStack_170;
  Matrix3d local_160;
  double local_118;
  double dStack_110;
  double local_108;
  undefined8 uStack_100;
  double local_f8;
  double dStack_f0;
  double local_e8;
  double local_d8;
  double dStack_d0;
  double local_c8;
  undefined8 uStack_c0;
  double local_b8;
  undefined8 uStack_b0;
  double local_a8;
  double dStack_a0;
  double local_98;
  undefined8 uStack_90;
  double local_88;
  double dStack_80;
  double local_78;
  double local_68;
  double dStack_60;
  double local_58;
  double local_48;
  double dStack_40;
  double local_38;
  double *local_28;
  double *local_20;
  
  pdVar1 = (positions->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
           m_data;
  lVar2 = (positions->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
          m_cols;
  if (lVar2 < 0 && pdVar1 != (double *)0x0) {
    __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/MapBase.h"
                  ,0xb2,
                  "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>, Level = 0]"
                 );
  }
  uVar3 = (positions->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
          m_rows;
  if (0 < (long)uVar3) {
    if (lVar2 != 3) {
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/PlainObjectBase.h"
                    ,0x115,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, 3, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 3, 1>]"
                   );
    }
    if (((uVar3 != 1) && (2 < uVar3)) && (uVar3 != 3)) {
      dStack_d0 = *pdVar1;
      local_c8 = pdVar1[uVar3];
      local_d8 = pdVar1[uVar3 * 2];
      dStack_110 = pdVar1[3];
      local_178 = pdVar1[uVar3 + 3];
      dStack_170 = pdVar1[uVar3 * 2 + 3];
      dVar5 = pdVar1[uVar3 + 1] - local_c8;
      dVar6 = pdVar1[uVar3 * 2 + 1] - local_d8;
      dVar7 = pdVar1[uVar3 + 2] - local_178;
      dVar8 = pdVar1[uVar3 * 2 + 2] - dStack_170;
      dVar9 = pdVar1[2] - dStack_110;
      dVar4 = pdVar1[1] - dStack_d0;
      local_160.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [2] = dVar4 * dVar7 - dVar9 * dVar5;
      local_160.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [0] = dVar5 * dVar8 - dVar7 * dVar6;
      local_160.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [1] = dVar6 * dVar9 - dVar8 * dVar4;
      local_f8 = local_160.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[0];
      dStack_f0 = local_160.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[1];
      local_e8 = local_160.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[2];
      local_190 = 0;
      local_188 = 1;
      local_180 = 3;
      uStack_100 = 0;
      local_38 = dVar7 * dStack_d0 - dVar9 * local_c8;
      local_48 = dVar8 * local_c8 - dVar7 * local_d8;
      dStack_40 = dVar9 * local_d8 - dVar8 * dStack_d0;
      local_28 = &local_48;
      local_58 = dVar4 * local_178 + -dVar5 * dStack_110;
      local_68 = dVar5 * dStack_170 + -dVar6 * local_178;
      dStack_60 = dVar6 * dStack_110 + -dVar4 * dStack_170;
      local_20 = &local_68;
      uStack_90 = 0;
      uStack_c0 = 0;
      uStack_b0 = 0;
      local_198 = &local_160;
      local_118 = dStack_170;
      local_108 = local_178;
      local_b8 = dStack_110;
      local_a8 = local_c8;
      dStack_a0 = local_d8;
      local_98 = dStack_d0;
      this_00 = Eigen::CommaInitializer<Eigen::Matrix<double,3,3,0,3,3>>::operator_
                          ((CommaInitializer<Eigen::Matrix<double,3,3,0,3,3>> *)&local_198,
                           (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                            *)&local_28);
      local_78 = local_98 * local_108 + local_b8 * -local_c8;
      local_88 = local_a8 * local_118 + local_178 * -local_d8;
      dStack_80 = dStack_a0 * dStack_110 + dStack_170 * -dStack_d0;
      Eigen::CommaInitializer<Eigen::Matrix<double,3,3,0,3,3>>::operator_
                ((CommaInitializer<Eigen::Matrix<double,3,3,0,3,3>> *)this_00,
                 (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_88);
      if ((local_180 + local_190 == 3) && (local_188 == 3)) {
        if (&local_160 == __return_storage_ptr__) {
          __assert_fail("(!check_transpose_aliasing_run_time_selector <typename Derived::Scalar,blas_traits<Derived>::IsTransposed,OtherDerived> ::run(extract_data(dst), other)) && \"aliasing detected during transposition, use transposeInPlace() \" \"or evaluate the rhs into a temporary using .eval()\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/Transpose.h"
                        ,0x1b6,
                        "static void Eigen::internal::checkTransposeAliasing_impl<Eigen::Matrix<double, 3, 3>, Eigen::Transpose<Eigen::Matrix<double, 3, 3>>>::run(const Derived &, const OtherDerived &) [Derived = Eigen::Matrix<double, 3, 3>, OtherDerived = Eigen::Transpose<Eigen::Matrix<double, 3, 3>>, MightHaveTransposeAliasing = true]"
                       );
        }
        (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
        m_storage.m_data.array[0] =
             local_160.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[0];
        (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
        m_storage.m_data.array[1] =
             local_160.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[3];
        (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
        m_storage.m_data.array[2] =
             local_160.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[6];
        (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
        m_storage.m_data.array[3] =
             local_160.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[1];
        (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
        m_storage.m_data.array[4] =
             local_160.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[4];
        (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
        m_storage.m_data.array[5] =
             local_160.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[7];
        (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
        m_storage.m_data.array[6] =
             local_160.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[2];
        (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
        m_storage.m_data.array[7] =
             local_160.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[5];
        (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
        m_storage.m_data.array[8] =
             local_160.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[8];
        return __return_storage_ptr__;
      }
      __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/CommaInitializer.h"
                    ,0x7c,
                    "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 3, 3>>::finished() [MatrixType = Eigen::Matrix<double, 3, 3>]"
                   );
    }
  }
  __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/Block.h"
                ,0x7a,
                "Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = 1, BlockCols = -1, InnerPanel = false]"
               );
}

Assistant:

Eigen::Matrix3d QuadRegion::_calcPolyBasis(Eigen::MatrixXd positions) {
    Eigen::Vector3d a = positions.row(0);
    Eigen::Vector3d b = positions.row(1);
    Eigen::Vector3d c = positions.row(2);
    Eigen::Vector3d d = positions.row(3);

    Eigen::Matrix3d polyBasis;
    polyBasis <<  //
        (b - a).cross(c - d),  //
        a.cross(c - d) + (b - a).cross(d),  //
        a.cross(d);

    return polyBasis.transpose();
  }